

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

ptls_private_key_result_t
sign_start(ptls_sign_certificate_t *do_sign,ptls_t *tls,uint16_t *selected_algorithm,
          ptls_buffer_t *output,ptls_iovec_t input,uint16_t *algorithms,size_t num_algorithms)

{
  ptls_private_key_result_t pVar1;
  size_t __size;
  
  __size = input.len;
  retry_count = 0;
  in.base = (uint8_t *)malloc(__size);
  pVar1 = ptls_private_key_failure;
  if (in.base != (uint8_t *)0x0) {
    in.len = __size;
    memcpy(in.base,input.base,__size);
    algos = (uint16_t *)malloc(num_algorithms * 2);
    if (algos != (uint16_t *)0x0) {
      memcpy(algos,algorithms,num_algorithms * 2);
      num_algos = num_algorithms;
      pVar1 = ptls_private_key_retry;
    }
  }
  return pVar1;
}

Assistant:

enum ptls_private_key_result_t sign_start(ptls_sign_certificate_t *do_sign,
                                          ptls_t *tls,
                                          uint16_t *selected_algorithm,
                                          ptls_buffer_t *output,
                                          ptls_iovec_t input,
                                          const uint16_t *algorithms,
                                          size_t num_algorithms)
{
    msg("sign_start, in len: %ld algoriths %ld", input.len, num_algorithms);
    /* Remove the comments from the following to have no offload:
    int rc = do_sign->cb(do_sign, tls, selected_algorithm, output, input, algorithms,
                         num_algorithms);
    if (rc != 0)
        return ptls_private_key_failure;
    return ptls_private_key_success;
    */
    retry_count = 0;
    in.base = malloc(input.len);
    if (!in.base)
    {
        msg("WHAT!!! CANT ALLOCATE %d BYTES!", input.len);
        return ptls_private_key_failure;
    }
    in.len = input.len;
    memcpy(in.base, input.base, input.len);
    algos = malloc(num_algorithms * sizeof(uint16_t));
    if (!algos)
    {
        msg("WHAT!!! CANT ALLOCATE ALGOS %d BYTES!",num_algorithms * sizeof(uint16_t));
        return ptls_private_key_failure;
    }
    memcpy(algos, algorithms, num_algorithms * sizeof(uint16_t));
    num_algos = num_algorithms;
    return ptls_private_key_retry;
}